

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

int __thiscall
CombinedH264Demuxer::simpleDemuxBlock
          (CombinedH264Demuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  CombinedH264Reader *this_00;
  long lVar1;
  pointer puVar2;
  int iVar3;
  uint uVar4;
  ReadState RVar5;
  undefined4 extraout_var;
  ulong uVar6;
  uint8_t *puVar7;
  size_t __n;
  uint8_t *end;
  pointer __src;
  uint8_t *dataEnd;
  uint8_t *data;
  bool isFirstBlock;
  uint32_t readedBytes;
  int readRez;
  MemoryBlock *local_48;
  CombinedH264Demuxer *local_40;
  uint8_t *local_38;
  
  this_00 = &this->super_CombinedH264Reader;
  if ((this->super_CombinedH264Reader).m_firstDemuxCall == true) {
    CombinedH264Reader::fillPids(this_00,acceptedPIDs,0);
    (this->super_CombinedH264Reader).m_firstDemuxCall = false;
  }
  *discardSize = 0;
  readRez = 0;
  iVar3 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&readedBytes,&readRez);
  if (readRez == 2) {
    this->m_lastReadRez = 2;
    iVar3 = 2;
  }
  else {
    __n = (this->super_CombinedH264Reader).m_tmpBuffer.m_size;
    if ((__n + readedBytes == 0) || ((readedBytes == 0 && (this->m_lastReadRez == 1)))) {
      this->m_lastReadRez = readRez;
      iVar3 = 1;
    }
    else {
      if (readedBytes == 0) {
        uVar6 = 0;
      }
      else {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)readedBytes);
        uVar6 = (ulong)readedBytes;
        __n = (this->super_CombinedH264Reader).m_tmpBuffer.m_size;
      }
      this->m_lastReadRez = readRez;
      lVar1 = CONCAT44(extraout_var,iVar3) + uVar6;
      end = (uint8_t *)(lVar1 + 0x80);
      data = (uint8_t *)(CONCAT44(extraout_var,iVar3) + 0x80);
      if (__n != 0) {
        data = data + -__n;
        puVar2 = (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __src = (pointer)0x0;
        if (puVar2 != (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          __src = puVar2;
        }
        memcpy(data,__src,__n);
        (this->super_CombinedH264Reader).m_tmpBuffer.m_size = 0;
      }
      local_48 = &(this->super_CombinedH264Reader).m_tmpBuffer;
      puVar7 = NALUnit::findNALWithStartCode(data + 3,end,true);
      local_38 = (uint8_t *)(lVar1 + 0x7c);
      local_40 = this;
      while (dataEnd = puVar7, data < local_38) {
        uVar4 = CombinedH264Reader::getPrefixLen(data,end);
        if (uVar4 == 0) {
          RVar5 = (this->super_CombinedH264Reader).m_state;
LAB_0019592b:
          if (RVar5 == Primary) goto LAB_00195976;
          if (RVar5 == Both) {
            CombinedH264Reader::addDataToPrimary(this_00,data,dataEnd,demuxedData,discardSize);
            this = local_40;
          }
          CombinedH264Reader::addDataToSecondary(this_00,data,dataEnd,demuxedData,discardSize);
        }
        else {
          RVar5 = CombinedH264Reader::detectStreamByNal(this_00,data + uVar4,dataEnd);
          (this->super_CombinedH264Reader).m_state = RVar5;
          if (RVar5 != NeedMoreData) goto LAB_0019592b;
          if ((long)end - (long)data < 0x80) {
            MemoryBlock::append(local_48,data,(long)end - (long)data);
            return 0;
          }
          (this->super_CombinedH264Reader).m_state = Primary;
LAB_00195976:
          CombinedH264Reader::addDataToPrimary(this_00,data,dataEnd,demuxedData,discardSize);
        }
        puVar7 = NALUnit::findNALWithStartCode(dataEnd + 3,end,true);
        data = dataEnd;
      }
      iVar3 = 0;
      if (data < end) {
        if (this->m_lastReadRez == 1) {
          if ((this->super_CombinedH264Reader).m_state == Primary) {
            CombinedH264Reader::addDataToPrimary(this_00,data,end,demuxedData,discardSize);
          }
          else {
            CombinedH264Reader::addDataToSecondary(this_00,data,end,demuxedData,discardSize);
          }
        }
        else {
          MemoryBlock::append(local_48,data,(long)end - (long)data);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int CombinedH264Demuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        fillPids(acceptedPIDs, 0);
        m_firstDemuxCall = false;
    }

    discardSize = 0;

    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }

    if (readedBytes + m_tmpBuffer.size() == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += MAX_TMP_BUFFER_SIZE;
    uint8_t* dataEnd = data + readedBytes;
    if (m_tmpBuffer.size() > 0)
    {
        data -= m_tmpBuffer.size();
        memcpy(data, m_tmpBuffer.data(), m_tmpBuffer.size());
        m_tmpBuffer.clear();
    }
    uint8_t* curNal = data;

    uint8_t* nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    while (curNal < dataEnd - 4)
    {
        const int prefixLen = getPrefixLen(curNal, dataEnd);
        if (prefixLen != 0)
        {
            m_state = detectStreamByNal(curNal + prefixLen, nextNal);
            if (m_state == ReadState::NeedMoreData)
            {
                if (dataEnd - curNal < MAX_TMP_BUFFER_SIZE)
                {
                    m_tmpBuffer.append(curNal, dataEnd - curNal);
                    return 0;
                }
                // some error in a stream, just ignore
                m_state = ReadState::Primary;
            }
        }
        if (m_state == ReadState::Both)
        {
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        }
        else if (m_state == ReadState::Primary)
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
        else
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        curNal = nextNal;
        nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    }

    if (curNal < dataEnd)
    {
        if (m_lastReadRez == BufferedReader::DATA_EOF)
        {
            if (m_state == ReadState::Primary)
                addDataToPrimary(curNal, dataEnd, demuxedData, discardSize);
            else
                addDataToSecondary(curNal, dataEnd, demuxedData, discardSize);
        }
        else
        {
            m_tmpBuffer.append(curNal, dataEnd - curNal);
        }
    }

    return 0;
}